

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

vector<crnlib::dynamic_string> * __thiscall
crnlib::vector<crnlib::dynamic_string>::operator=
          (vector<crnlib::dynamic_string> *this,vector<crnlib::dynamic_string> *other)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  dynamic_string *pdVar4;
  dynamic_string *this_00;
  long lVar5;
  
  if (this != other) {
    uVar3 = other->m_size;
    if (this->m_capacity < uVar3) {
      pdVar4 = this->m_p;
      if (pdVar4 != (dynamic_string *)0x0) {
        uVar3 = this->m_size;
        if ((ulong)uVar3 != 0) {
          lVar5 = 0;
          do {
            lVar1 = *(long *)((long)&pdVar4->m_pStr + lVar5);
            if ((lVar1 != 0) && ((*(uint *)(lVar1 + -8) ^ *(uint *)(lVar1 + -4)) == 0xffffffff)) {
              crnlib_free((void *)(lVar1 + -0x10));
            }
            lVar5 = lVar5 + 0x10;
          } while ((ulong)uVar3 << 4 != lVar5);
          pdVar4 = this->m_p;
        }
        crnlib_free(pdVar4);
        this->m_p = (dynamic_string *)0x0;
        this->m_size = 0;
        this->m_capacity = 0;
        uVar3 = other->m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this,uVar3,false,0x10,(object_mover)0x0,false);
    }
    else {
      uVar3 = this->m_size;
      if ((ulong)uVar3 != 0) {
        pdVar4 = this->m_p;
        lVar5 = 0;
        do {
          lVar1 = *(long *)((long)&pdVar4->m_pStr + lVar5);
          if ((lVar1 != 0) && ((*(uint *)(lVar1 + -8) ^ *(uint *)(lVar1 + -4)) == 0xffffffff)) {
            crnlib_free((void *)(lVar1 + -0x10));
          }
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar3 << 4 != lVar5);
        this->m_size = 0;
      }
    }
    uVar2 = other->m_size;
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      pdVar4 = other->m_p;
      this_00 = this->m_p;
      do {
        dynamic_string::dynamic_string(this_00,pdVar4);
        uVar2 = uVar2 - 1;
        pdVar4 = pdVar4 + 1;
        this_00 = this_00 + 1;
      } while (uVar2 != 0);
      uVar2 = other->m_size;
    }
    this->m_size = uVar2;
  }
  return this;
}

Assistant:

inline vector& operator=(const vector& other)
        {
            if (this == &other)
            {
                return *this;
            }

            if (m_capacity >= other.m_size)
            {
                resize(0);
            }
            else
            {
                clear();
                increase_capacity(other.m_size, false);
            }

            if (CRNLIB_IS_BITWISE_COPYABLE(T))
            {
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
            }
            else
            {
                T* pDst = m_p;
                const T* pSrc = other.m_p;
                for (uint i = other.m_size; i > 0; i--)
                {
                    helpers::construct(pDst++, *pSrc++);
                }
            }

            m_size = other.m_size;

            return *this;
        }